

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O2

void __thiscall FileReader::FileReader(FileReader *this,string *filename)

{
  FILE *pFVar1;
  posixerror *this_00;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (this->super_ReadWriter)._readonly = false;
  (this->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__FileReader_001421d0;
  std::__cxx11::string::string((string *)&this->_filename,filename);
  this->_state = STATE_FLUSHED;
  pFVar1 = fopen((this->_filename)._M_dataplus._M_p,"r+b");
  this->_f = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    pFVar1 = fopen((this->_filename)._M_dataplus._M_p,"w+b");
    this->_f = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      this_00 = (posixerror *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"appending ",&local_61)
      ;
      std::operator+(&local_40,&local_60,&this->_filename);
      posixerror::posixerror(this_00,&local_40);
      __cxa_throw(this_00,&posixerror::typeinfo,posixerror::~posixerror);
    }
  }
  return;
}

Assistant:

FileReader(const std::string& filename, opencreate_t)
        : _filename(filename), _state(STATE_FLUSHED)
    {
        _f= fopen(_filename.c_str(), "r+b");
        if (_f==NULL) {
            _f= fopen(_filename.c_str(), "w+b");
            if (_f==NULL)
                throw posixerror(std::string("appending ")+_filename);
        }
        //printf("create  file: %p %s\n", _f, filename.c_str());
    }